

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O2

void fe4_canon(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t x2;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar1 = *arg1;
  uVar2 = arg1[1];
  uVar3 = arg1[2];
  uVar6 = (ulong)(uVar2 != 0xffffffffffffffff || uVar2 + 1 < (ulong)(uVar1 < 0xffffffffffffffed));
  uVar5 = arg1[3];
  uVar9 = (ulong)(uVar3 != 0xffffffffffffffff || uVar3 + 1 < uVar6);
  uVar4 = -(ulong)(uVar5 < 0x7fffffffffffffff || uVar5 + 0x8000000000000001 < uVar9);
  uVar8 = ~uVar4;
  uVar10 = uVar1 + 0x13 & uVar8 | uVar1 & uVar4;
  uVar7 = (uVar2 + 1) - (ulong)(uVar1 < 0xffffffffffffffed) & uVar8 | uVar2 & uVar4;
  uVar6 = (uVar3 + 1) - uVar6 & uVar8 | uVar3 & uVar4;
  uVar9 = uVar8 & (uVar5 + 0x8000000000000001) - uVar9 | uVar4 & uVar5;
  uVar1 = (ulong)(uVar7 != 0xffffffffffffffff || uVar7 + 1 < (ulong)(uVar10 < 0xffffffffffffffed));
  uVar2 = (ulong)(uVar6 != 0xffffffffffffffff || uVar6 + 1 < uVar1);
  uVar3 = -(ulong)(uVar9 < 0x7fffffffffffffff || uVar9 + 0x8000000000000001 < uVar2);
  uVar5 = ~uVar3;
  *out1 = uVar10 + 0x13 & uVar5 | uVar10 & uVar3;
  out1[1] = (uVar7 + 1) - (ulong)(uVar10 < 0xffffffffffffffed) & uVar5 | uVar7 & uVar3;
  out1[2] = (uVar6 + 1) - uVar1 & uVar5 | uVar6 & uVar3;
  out1[3] = uVar5 & (uVar9 + 0x8000000000000001) - uVar2 | uVar3 & uVar9;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_canon(uint64_t out1[4], const uint64_t arg1[4]) {
  uint64_t x1;
  fiat_uint1 x2;
  uint64_t x3;
  fiat_uint1 x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  fiat_uint1 x8;
  uint64_t x9;
  uint64_t x10;
  uint64_t x11;
  uint64_t x12;
  uint64_t x13;
  fiat_uint1 x14;
  uint64_t x15;
  fiat_uint1 x16;
  uint64_t x17;
  fiat_uint1 x18;
  uint64_t x19;
  fiat_uint1 x20;
  uint64_t x21;
  uint64_t x22;
  uint64_t x23;
  uint64_t x24;
  fiat_subborrowx_u64(&x1, &x2, 0x0, (arg1[0]), UINT64_C(0xffffffffffffffed));
  fiat_subborrowx_u64(&x3, &x4, x2, (arg1[1]), UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x5, &x6, x4, (arg1[2]), UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x7, &x8, x6, (arg1[3]), UINT64_C(0x7fffffffffffffff));
  fiat_cmovznz_u64(&x9, x8, x1, (arg1[0]));
  fiat_cmovznz_u64(&x10, x8, x3, (arg1[1]));
  fiat_cmovznz_u64(&x11, x8, x5, (arg1[2]));
  fiat_cmovznz_u64(&x12, x8, x7, (arg1[3]));
  fiat_subborrowx_u64(&x13, &x14, 0x0, x9, UINT64_C(0xffffffffffffffed));
  fiat_subborrowx_u64(&x15, &x16, x14, x10, UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x17, &x18, x16, x11, UINT64_C(0xffffffffffffffff));
  fiat_subborrowx_u64(&x19, &x20, x18, x12, UINT64_C(0x7fffffffffffffff));
  fiat_cmovznz_u64(&x21, x20, x13, x9);
  fiat_cmovznz_u64(&x22, x20, x15, x10);
  fiat_cmovznz_u64(&x23, x20, x17, x11);
  fiat_cmovznz_u64(&x24, x20, x19, x12);
  out1[0] = x21;
  out1[1] = x22;
  out1[2] = x23;
  out1[3] = x24;
}